

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void kj::ArrayDisposer::Dispose_<capnp::compiler::CompilerMain::OutputDirective>::destruct
               (void *ptr)

{
  long lVar1;
  undefined8 uVar2;
  
  if ((*(char *)((long)ptr + 0x10) == '\x01') && (lVar1 = *(long *)((long)ptr + 0x18), lVar1 != 0))
  {
    uVar2 = *(undefined8 *)((long)ptr + 0x20);
    *(undefined8 *)((long)ptr + 0x18) = 0;
    *(undefined8 *)((long)ptr + 0x20) = 0;
    (**(code **)**(undefined8 **)((long)ptr + 0x28))
              (*(undefined8 **)((long)ptr + 0x28),lVar1,0x18,uVar2,uVar2,
               Dispose_<kj::String>::destruct);
  }
  return;
}

Assistant:

static void destruct(void* ptr) {
    kj::dtor(*reinterpret_cast<T*>(ptr));
  }